

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step1.cpp
# Opt level: O1

void __thiscall
ruckig::PositionThirdOrderStep1::time_none_two_step
          (PositionThirdOrderStep1 *this,ProfileIter *profile,double vMax,double vMin,double aMax,
          double aMin,double jMax)

{
  Profile *pPVar1;
  ProfileIter pvVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  BrakeProfile *pBVar6;
  BrakeProfile *pBVar7;
  byte bVar8;
  
  bVar8 = 0;
  dVar3 = (this->vf - this->v0) * jMax + (this->a0_a0 + this->af_af) * 0.5;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar3 = (ABS(jMax) * dVar3) / jMax;
  pPVar1 = *profile;
  (pPVar1->t)._M_elems[0] = (dVar3 - this->a0) / jMax;
  (pPVar1->t)._M_elems[1] = 0.0;
  (pPVar1->t)._M_elems[2] = (dVar3 - this->af) / jMax;
  (pPVar1->t)._M_elems[3] = 0.0;
  (pPVar1->t)._M_elems[4] = 0.0;
  (pPVar1->t)._M_elems[5] = 0.0;
  (pPVar1->t)._M_elems[6] = 0.0;
  bVar4 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                    (pPVar1,jMax,vMax,vMin,aMax,aMin);
  if (!bVar4) {
    pPVar1 = *profile;
    (pPVar1->t)._M_elems[0] = (this->af - this->a0) / jMax;
    (pPVar1->t)._M_elems[1] = 0.0;
    (pPVar1->t)._M_elems[2] = 0.0;
    (pPVar1->t)._M_elems[3] = 0.0;
    (pPVar1->t)._M_elems[4] = 0.0;
    (pPVar1->t)._M_elems[5] = 0.0;
    (pPVar1->t)._M_elems[6] = 0.0;
    bVar4 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                      (pPVar1,jMax,vMax,vMin,aMax,aMin);
    if (!bVar4) {
      return;
    }
  }
  pvVar2 = *profile;
  *profile = pvVar2 + 1;
  dVar3 = (pvVar2->v)._M_elems[0];
  pvVar2[1].a._M_elems[0] = (pvVar2->a)._M_elems[0];
  pvVar2[1].v._M_elems[0] = dVar3;
  pvVar2[1].p._M_elems[0] = (pvVar2->p)._M_elems[0];
  pvVar2[1].af = pvVar2->af;
  dVar3 = pvVar2->vf;
  pvVar2[1].pf = pvVar2->pf;
  pvVar2[1].vf = dVar3;
  pBVar6 = &pvVar2->brake;
  pBVar7 = &pvVar2[1].brake;
  for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
    pBVar7->duration = pBVar6->duration;
    pBVar6 = (BrakeProfile *)((long)pBVar6 + (ulong)bVar8 * -0x10 + 8);
    pBVar7 = (BrakeProfile *)((long)pBVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  pBVar6 = &pvVar2->accel;
  pBVar7 = &pvVar2[1].accel;
  for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
    pBVar7->duration = pBVar6->duration;
    pBVar6 = (BrakeProfile *)((long)pBVar6 + (ulong)bVar8 * -0x10 + 8);
    pBVar7 = (BrakeProfile *)((long)pBVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  return;
}

Assistant:

void PositionThirdOrderStep1::time_none_two_step(ProfileIter& profile, double vMax, double vMin, double aMax, double aMin, double jMax) const {
    // Two step
    {
        const double h0 = std::sqrt((a0_a0 + af_af)/2 + jMax*(vf - v0)) * std::abs(jMax) / jMax;
        profile->t[0] = (h0 - a0)/jMax;
        profile->t[1] = 0;
        profile->t[2] = (h0 - af)/jMax;
        profile->t[3] = 0;
        profile->t[4] = 0;
        profile->t[5] = 0;
        profile->t[6] = 0;

        if (profile->check<ControlSigns::UDDU, ReachedLimits::NONE>(jMax, vMax, vMin, aMax, aMin)) {
            add_profile(profile);
            return;
        }
    }

    // Single step
    {
        profile->t[0] = (af - a0)/jMax;
        profile->t[1] = 0;
        profile->t[2] = 0;
        profile->t[3] = 0;
        profile->t[4] = 0;
        profile->t[5] = 0;
        profile->t[6] = 0;

        if (profile->check<ControlSigns::UDDU, ReachedLimits::NONE>(jMax, vMax, vMin, aMax, aMin)) {
            add_profile(profile);
            return;
        }
    }
}